

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

bool __thiscall mocker::detail::MoveInfo::isMoveRelated(MoveInfo *this,Node *n)

{
  bool bVar1;
  mapped_type *this_00;
  reference x;
  value_type *mov;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  mapped_type *movs;
  Node *n_local;
  MoveInfo *this_local;
  
  this_00 = std::
            unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>_>
            ::at(&this->associatedMoves,n);
  __end2 = std::
           unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           ::begin(this_00);
  mov = (value_type *)
        std::
        unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> *)&mov);
    if (!bVar1) {
      return false;
    }
    x = std::__detail::_Node_const_iterator<std::shared_ptr<mocker::nasm::Mov>,_true,_true>::
        operator*(&__end2);
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->worklist,x);
    if (bVar1) break;
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->active,x);
    if (bVar1) {
      return true;
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<mocker::nasm::Mov>,_true,_true>::operator++
              (&__end2);
  }
  return true;
}

Assistant:

bool MoveInfo::isMoveRelated(const Node &n) const {
  auto &movs = associatedMoves.at(n);
  for (auto &mov : movs) {
    if (isIn(worklist, mov))
      return true;
    if (isIn(active, mov))
      return true;
  }
  return false;
}